

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

ScalarFunction * duckdb::IlikeEscapeFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff04;
  FunctionNullHandling in_stack_ffffffffffffff10;
  allocator_type local_ea;
  allocator local_e9;
  code *bind_lambda;
  LogicalType local_c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_b0;
  LogicalType local_98;
  string local_80;
  LogicalType local_60 [3];
  
  ::std::__cxx11::string::string((string *)&local_80,"ilike_escape",&local_e9);
  LogicalType::LogicalType(local_60,VARCHAR);
  LogicalType::LogicalType(local_60 + 1,VARCHAR);
  LogicalType::LogicalType(local_60 + 2,VARCHAR);
  __l._M_len = 3;
  __l._M_array = local_60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_b0,__l,&local_ea);
  LogicalType::LogicalType(&local_c8,BOOLEAN);
  bind_lambda = LikeEscapeFunction<duckdb::ILikeEscapeOperator>;
  LogicalType::LogicalType(&local_98,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_98;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffefc;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff04;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_80,(vector<duckdb::LogicalType,_true> *)&local_b0,&local_c8,
             (scalar_function_t *)&stack0xffffffffffffff18,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_ffffffffffffff10,bind_lambda);
  LogicalType::~LogicalType(&local_98);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff18);
  LogicalType::~LogicalType(&local_c8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_b0);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_60[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_80);
  (in_RDI->super_BaseScalarFunction).collation_handling = PUSH_COMBINABLE_COLLATIONS;
  return in_RDI;
}

Assistant:

ScalarFunction IlikeEscapeFun::GetFunction() {
	ScalarFunction ilike_escape("ilike_escape", {LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR},
	                            LogicalType::BOOLEAN, LikeEscapeFunction<ILikeEscapeOperator>);
	ilike_escape.collation_handling = FunctionCollationHandling::PUSH_COMBINABLE_COLLATIONS;
	return ilike_escape;
}